

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O3

Token slang::parsing::Lexer::concatenateTokens
                (BumpAllocator *alloc,SourceManager *sourceManager,Token left,Token right)

{
  KeywordVersion KVar1;
  SourceLocation SVar2;
  size_t __n;
  size_t __n_00;
  byte *startPtr;
  uint32_t extraout_var;
  Info *extraout_RDX;
  size_t size;
  BumpAllocator *pBVar3;
  size_type __rlen;
  size_type __rlen_1;
  span<const_slang::parsing::Trivia,_18446744073709551615UL> sVar4;
  string_view sVar5;
  string_view sVar6;
  Token TVar7;
  Token local_4c0;
  Token token;
  Token right_local;
  Token left_local;
  table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>_>_>
  arrays;
  Diagnostics unused;
  Lexer lexer;
  
  right_local.info = right.info;
  right_local._0_8_ = right._0_8_;
  left_local.info = left.info;
  left_local._0_8_ = left._0_8_;
  SVar2 = Token::location(&left_local);
  sVar4 = Token::trivia(&left_local);
  sVar5 = Token::rawText(&left_local);
  __n = sVar5._M_len;
  sVar6 = Token::rawText(&right_local);
  __n_00 = sVar6._M_len;
  if (__n_00 == 0 || __n == 0) {
    Token::Token(&local_4c0);
    goto LAB_00410afc;
  }
  size = __n_00 + __n + 1;
  startPtr = alloc->head->current;
  if (alloc->endPtr < startPtr + __n_00 + __n + 1) {
    startPtr = BumpAllocator::allocateSlow(alloc,size,1);
  }
  else {
    alloc->head->current = startPtr + __n_00 + __n + 1;
  }
  memcpy(startPtr,sVar5._M_str,__n);
  memcpy(startPtr + __n,sVar6._M_str,__n_00);
  startPtr[__n_00 + __n] = 0;
  unused.super_SmallVector<slang::Diagnostic,_2UL>.super_SmallVectorBase<slang::Diagnostic>.data_ =
       (pointer)unused.super_SmallVector<slang::Diagnostic,_2UL>.
                super_SmallVectorBase<slang::Diagnostic>.firstElement;
  unused.super_SmallVector<slang::Diagnostic,_2UL>.super_SmallVectorBase<slang::Diagnostic>.len = 0;
  unused.super_SmallVector<slang::Diagnostic,_2UL>.super_SmallVectorBase<slang::Diagnostic>.cap = 2;
  arrays.groups_size_index = 0x3f;
  arrays.groups_size_mask = 1;
  arrays.elements_ = (value_type_pointer)0x0;
  arrays.groups_ =
       (group_type_pointer)
       &boost::unordered::detail::foa::
        dummy_groups<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,2ul>()
        ::storage;
  sVar5._M_str = (char *)startPtr;
  sVar5._M_len = size;
  Lexer(&lexer,(BufferID)0xffffffff,sVar5,(char *)startPtr,alloc,&unused,sourceManager,
        (LexerOptions *)&arrays);
  boost::unordered::detail::foa::
  table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>_>_>
  ::~table_core((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>_>_>
                 *)&arrays);
  KVar1 = LexerFacts::getDefaultKeywordVersion(lexer.options.languageVersion);
  pBVar3 = (BumpAllocator *)(ulong)KVar1;
  token = lex(&lexer,KVar1);
  if (token.kind == Unknown) {
LAB_00410aac:
    alloc = pBVar3;
    Token::Token(&local_4c0);
  }
  else {
    sVar5 = Token::rawText(&token);
    if (sVar5._M_len == 0) goto LAB_00410aac;
    KVar1 = LexerFacts::getDefaultKeywordVersion(lexer.options.languageVersion);
    pBVar3 = (BumpAllocator *)(ulong)KVar1;
    TVar7 = lex(&lexer,KVar1);
    if (TVar7.kind != EndOfFile) goto LAB_00410aac;
    sVar5 = Token::rawText(&token);
    local_4c0._0_4_ =
         Token::clone(&token,(__fn *)alloc,sVar4._M_ptr,(int)sVar4._M_extent._M_extent_value,
                      (void *)sVar5._M_len,sVar5._M_str,SVar2);
    local_4c0.rawLen = extraout_var;
    local_4c0.info = extraout_RDX;
  }
  if (lexer.stringBuffer.super_SmallVectorBase<char>.data_ !=
      lexer.stringBuffer.super_SmallVectorBase<char>.firstElement) {
    operator_delete(lexer.stringBuffer.super_SmallVectorBase<char>.data_);
  }
  if (lexer.triviaBuffer.super_SmallVectorBase<slang::parsing::Trivia>.data_ !=
      (pointer)lexer.triviaBuffer.super_SmallVectorBase<slang::parsing::Trivia>.firstElement) {
    operator_delete(lexer.triviaBuffer.super_SmallVectorBase<slang::parsing::Trivia>.data_);
  }
  boost::unordered::detail::foa::
  table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>_>_>
  ::~table_core((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>_>_>
                 *)&lexer.options);
  SmallVectorBase<slang::Diagnostic>::cleanup
            ((SmallVectorBase<slang::Diagnostic> *)&unused,(EVP_PKEY_CTX *)alloc);
LAB_00410afc:
  TVar7.info = local_4c0.info;
  TVar7.kind = local_4c0.kind;
  TVar7._2_1_ = local_4c0._2_1_;
  TVar7.numFlags.raw = local_4c0.numFlags.raw;
  TVar7.rawLen = local_4c0.rawLen;
  return TVar7;
}

Assistant:

Token Lexer::concatenateTokens(BumpAllocator& alloc, SourceManager& sourceManager, Token left,
                               Token right) {
    auto location = left.location();
    auto trivia = left.trivia();

    // if either side is empty, we have an error; the user tried to concatenate some weird kind of
    // token
    auto leftText = left.rawText();
    auto rightText = right.rawText();
    if (leftText.empty() || rightText.empty())
        return Token();

    // combine the text for both sides; make sure to include room for a null
    size_t newLength = leftText.length() + rightText.length() + 1;
    char* mem = (char*)alloc.allocate(newLength, 1);
    leftText.copy(mem, leftText.length());
    rightText.copy(mem + leftText.length(), rightText.length());
    mem[newLength - 1] = '\0';
    std::string_view combined{mem, newLength};

    Diagnostics unused;
    Lexer lexer{BufferID::getPlaceholder(),
                combined,
                combined.data(),
                alloc,
                unused,
                sourceManager,
                LexerOptions{}};

    auto token = lexer.lex();
    if (token.kind == TokenKind::Unknown || token.rawText().empty())
        return Token();

    // make sure the next token is an EoF, otherwise the tokens were unable to
    // be combined and should be left alone
    if (lexer.lex().kind != TokenKind::EndOfFile)
        return Token();

    return token.clone(alloc, trivia, token.rawText(), location);
}